

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

bool __thiscall cmCPackIFWRepository::ConfigureFromOptions(cmCPackIFWRepository *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  char *local_1d8;
  char *displayName;
  char *local_1b0;
  char *password;
  char *local_188;
  char *username;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  char *local_140;
  char *newUrl;
  char *local_118;
  char *oldUrl;
  char *local_f0;
  char *url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string prefix;
  cmCPackIFWRepository *this_local;
  
  prefix.field_2._8_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_78,&this->Name);
    std::operator+(&local_58,"CPACK_IFW_REPOSITORY_",&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_58,"_");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "ADD");
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      this->Update = Add;
    }
    else {
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     "REMOVE");
      bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      if (bVar1) {
        this->Update = Remove;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                       ,"REPLACE");
        bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)&url);
        std::__cxx11::string::~string((string *)&url);
        if (bVar1) {
          this->Update = Replace;
        }
        else {
          this->Update = None;
        }
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oldUrl,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "URL");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&oldUrl);
    std::__cxx11::string::~string((string *)&oldUrl);
    local_f0 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Url,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Url,pcVar3);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newUrl,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "OLD_URL");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&newUrl);
    std::__cxx11::string::~string((string *)&newUrl);
    local_118 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->OldUrl,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->OldUrl,pcVar3);
    }
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "NEW_URL");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    local_140 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->NewUrl,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->NewUrl,pcVar3);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&username,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "DISABLED");
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)&username);
    std::__cxx11::string::~string((string *)&username);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Enabled,"0");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Enabled,"");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&password,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "USERNAME");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&password);
    std::__cxx11::string::~string((string *)&password);
    local_188 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Username,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Username,pcVar3);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&displayName
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "PASSWORD");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&displayName);
    std::__cxx11::string::~string((string *)&displayName);
    local_1b0 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Password,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Password,pcVar3);
    }
    std::operator+(&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "DISPLAY_NAME");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    local_1d8 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->DisplayName,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->DisplayName,pcVar3);
    }
    this_local._7_1_ = IsValid(this);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCPackIFWRepository::ConfigureFromOptions()
{
  // Name;
  if (this->Name.empty()) {
    return false;
  }

  std::string prefix =
    "CPACK_IFW_REPOSITORY_" + cmsys::SystemTools::UpperCase(this->Name) + "_";

  // Update
  if (this->IsOn(prefix + "ADD")) {
    this->Update = cmCPackIFWRepository::Add;
  } else if (IsOn(prefix + "REMOVE")) {
    this->Update = cmCPackIFWRepository::Remove;
  } else if (IsOn(prefix + "REPLACE")) {
    this->Update = cmCPackIFWRepository::Replace;
  } else {
    this->Update = cmCPackIFWRepository::None;
  }

  // Url
  if (const char* url = this->GetOption(prefix + "URL")) {
    this->Url = url;
  } else {
    this->Url = "";
  }

  // Old url
  if (const char* oldUrl = this->GetOption(prefix + "OLD_URL")) {
    this->OldUrl = oldUrl;
  } else {
    this->OldUrl = "";
  }

  // New url
  if (const char* newUrl = this->GetOption(prefix + "NEW_URL")) {
    this->NewUrl = newUrl;
  } else {
    this->NewUrl = "";
  }

  // Enabled
  if (this->IsOn(prefix + "DISABLED")) {
    this->Enabled = "0";
  } else {
    this->Enabled = "";
  }

  // Username
  if (const char* username = this->GetOption(prefix + "USERNAME")) {
    this->Username = username;
  } else {
    this->Username = "";
  }

  // Password
  if (const char* password = this->GetOption(prefix + "PASSWORD")) {
    this->Password = password;
  } else {
    this->Password = "";
  }

  // DisplayName
  if (const char* displayName = this->GetOption(prefix + "DISPLAY_NAME")) {
    this->DisplayName = displayName;
  } else {
    this->DisplayName = "";
  }

  return this->IsValid();
}